

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitExtractLaneExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  WasmType type;
  WasmRegisterSpace *this_00;
  EmitInfo EVar1;
  undefined6 in_register_00000032;
  EmitInfo local_40;
  EmitInfo indexInfo;
  EmitInfo simdArgInfo;
  
  type = *signature;
  indexInfo = PopEvalStack(this,signature[1],L"Argument should be of type V128");
  ReleaseLocation(this,&indexInfo);
  this_00 = GetRegisterSpace(this,type);
  EVar1.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
  local_40 = EmitLaneIndex(this,op);
  ReleaseLocation(this,&local_40);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x10])
            (this->m_writer,CONCAT62(in_register_00000032,op) & 0xffffffff,
             (ulong)EVar1.super_EmitInfoBase.location,(ulong)indexInfo & 0xffffffff,
             (ulong)local_40 & 0xffffffff);
  EVar1.type = type;
  return EVar1;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitExtractLaneExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature)
{
    WasmTypes::WasmType resultType = signature[0];
    WasmTypes::WasmType simdArgType = signature[1];

    EmitInfo simdArgInfo = PopEvalStack(simdArgType, _u("Argument should be of type V128"));
    ReleaseLocation(&simdArgInfo);

    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();
    EmitInfo resultInfo(resultReg, resultType);

    //put index into a register to reuse the existing infra in Interpreter and Compiler
    EmitInfo indexInfo = EmitLaneIndex(op);
    ReleaseLocation(&indexInfo);

    m_writer->AsmReg3(op, resultReg, simdArgInfo.location, indexInfo.location);
    return resultInfo;
}